

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall
crnlib::symbol_codec::encode_transmit_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,bool simulate,
          static_huffman_data_model *pDeltaModel)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  uint local_16c;
  uint local_114;
  uint extra_bits;
  uint extra;
  uint code_1;
  uint i_5;
  uint i_4;
  uint total_bits;
  uint num_codelength_codes_to_send;
  static_huffman_data_model dm;
  uint code;
  uint i_3;
  uint16 hist [21];
  uint len;
  uint i_2;
  int delta;
  uint i_1;
  vector<unsigned_char> delta_code_sizes;
  uint8 *pCodesizes;
  uint cur_nonzero_run_size;
  uint cur_zero_run_size;
  uint prev_len;
  undefined1 local_48 [8];
  vector<unsigned_short> codes;
  uint i;
  uint total_used_syms;
  static_huffman_data_model *pDeltaModel_local;
  bool simulate_local;
  static_huffman_data_model *model_local;
  symbol_codec *this_local;
  
  codes.m_capacity = 0;
  for (codes.m_size = model->m_total_syms; codes.m_size != 0; codes.m_size = codes.m_size - 1) {
    puVar7 = vector<unsigned_char>::operator[](&model->m_code_sizes,codes.m_size - 1);
    if (*puVar7 != '\0') {
      codes.m_capacity = codes.m_size;
      break;
    }
  }
  if (codes.m_capacity == 0) {
    if (!simulate) {
      uVar4 = math::total_bits(0x2000);
      encode_bits(this,0,uVar4);
    }
    uVar4 = math::total_bits(0x2000);
    return uVar4;
  }
  vector<unsigned_short>::vector((vector<unsigned_short> *)local_48);
  vector<unsigned_short>::reserve((vector<unsigned_short> *)local_48,model->m_total_syms);
  cur_nonzero_run_size = 0xffffffff;
  pCodesizes._4_4_ = 0;
  pCodesizes._0_4_ = 0;
  delta_code_sizes._8_8_ = vector<unsigned_char>::operator[](&model->m_code_sizes,0);
  vector<unsigned_char>::vector((vector<unsigned_char> *)&i_1);
  if ((pDeltaModel != (static_huffman_data_model *)0x0) &&
     (uVar4 = static_huffman_data_model::get_total_syms(pDeltaModel), uVar4 != 0)) {
    uVar4 = vector<unsigned_char>::size(&pDeltaModel->m_code_sizes);
    if (uVar4 < codes.m_capacity) {
      this_local._4_4_ = 0;
      goto LAB_00213851;
    }
    vector<unsigned_char>::resize((vector<unsigned_char> *)&i_1,codes.m_capacity,false);
    for (i_2 = 0; i_2 < codes.m_capacity; i_2 = i_2 + 1) {
      pbVar8 = vector<unsigned_char>::operator[](&model->m_code_sizes,i_2);
      bVar1 = *pbVar8;
      pbVar8 = vector<unsigned_char>::operator[](&pDeltaModel->m_code_sizes,i_2);
      len = (uint)bVar1 - (uint)*pbVar8;
      if ((int)len < 0) {
        len = len + 0x11;
      }
      puVar7 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)&i_1,i_2);
      *puVar7 = (uchar)len;
    }
    delta_code_sizes._8_8_ = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)&i_1);
  }
  for (stack0xffffffffffffff78 = 0; stack0xffffffffffffff78 <= codes.m_capacity;
      register0x00000000 = stack0xffffffffffffff78 + 1) {
    if (stack0xffffffffffffff78 < codes.m_capacity) {
      local_16c = (uint)*(byte *)delta_code_sizes._8_8_;
      delta_code_sizes._8_8_ = delta_code_sizes._8_8_ + 1;
    }
    else {
      local_16c = 0xff;
    }
    hist[0x12] = (undefined2)local_16c;
    hist[0x13] = local_16c._2_2_;
    if (local_16c == 0) {
      end_nonzero_run((uint *)&pCodesizes,cur_nonzero_run_size,(vector<unsigned_short> *)local_48);
      pCodesizes._4_4_ = pCodesizes._4_4_ + 1;
      if (pCodesizes._4_4_ == 0x8a) {
        end_zero_run((uint *)((long)&pCodesizes + 4),(vector<unsigned_short> *)local_48);
      }
    }
    else {
      end_zero_run((uint *)((long)&pCodesizes + 4),(vector<unsigned_short> *)local_48);
      if (hist._36_4_ == cur_nonzero_run_size) {
        pCodesizes._0_4_ = (int)pCodesizes + 1;
        if ((int)pCodesizes == 0x46) {
          end_nonzero_run((uint *)&pCodesizes,cur_nonzero_run_size,
                          (vector<unsigned_short> *)local_48);
        }
      }
      else {
        end_nonzero_run((uint *)&pCodesizes,cur_nonzero_run_size,(vector<unsigned_short> *)local_48)
        ;
        if (hist._36_4_ != 0xff) {
          hist[0x11] = hist[0x12];
          vector<unsigned_short>::push_back((vector<unsigned_short> *)local_48,hist + 0x11);
        }
      }
    }
    cur_nonzero_run_size._0_2_ = hist[0x12];
    cur_nonzero_run_size._2_2_ = hist[0x13];
  }
  utils::zero_object<unsigned_short[21]>((unsigned_short (*) [21])&code);
  for (dm._52_4_ = 0; uVar3 = dm._52_4_,
      uVar4 = vector<unsigned_short>::size((vector<unsigned_short> *)local_48), (uint)uVar3 < uVar4;
      dm._52_4_ = dm._52_4_ + 1) {
    puVar9 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_48,dm._52_4_);
    dm._48_4_ = *puVar9 & 0xff;
    *(short *)((long)&code + (ulong)(uint)dm._48_4_ * 2) =
         *(short *)((long)&code + (ulong)(uint)dm._48_4_ * 2) + 1;
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&total_bits);
  uVar5 = static_huffman_data_model::init
                    ((static_huffman_data_model *)&total_bits,(EVP_PKEY_CTX *)0x1);
  if ((uVar5 & 1) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    i_4 = 0x15;
    while ((i_4 != 0 &&
           (uVar4 = static_huffman_data_model::get_cost
                              ((static_huffman_data_model *)&total_bits,
                               (uint)(byte)g_most_probable_codelength_codes[i_4 - 1]), uVar4 == 0)))
    {
      i_4 = i_4 - 1;
    }
    uVar6 = math::total_bits(0x2000);
    uVar4 = codes.m_capacity;
    i_5 = i_4 * 3 + uVar6 + 5;
    if (!simulate) {
      uVar6 = math::total_bits(0x2000);
      encode_bits(this,uVar4,uVar6);
      encode_bits(this,i_4,5);
      for (code_1 = 0; code_1 < i_4; code_1 = code_1 + 1) {
        uVar4 = static_huffman_data_model::get_cost
                          ((static_huffman_data_model *)&total_bits,
                           (uint)(byte)g_most_probable_codelength_codes[code_1]);
        encode_bits(this,uVar4,3);
      }
    }
    for (extra = 0; uVar4 = vector<unsigned_short>::size((vector<unsigned_short> *)local_48),
        extra < uVar4; extra = extra + 1) {
      puVar9 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)local_48,extra);
      uVar2 = *puVar9;
      uVar5 = uVar2 & 0xff;
      local_114 = 0;
      if (uVar5 == 0x11) {
        local_114 = 3;
      }
      else if (uVar5 == 0x12) {
        local_114 = 7;
      }
      else if (uVar5 == 0x13) {
        local_114 = 2;
      }
      else if (uVar5 == 0x14) {
        local_114 = 6;
      }
      uVar4 = static_huffman_data_model::get_cost((static_huffman_data_model *)&total_bits,uVar5);
      i_5 = uVar4 + i_5;
      if (!simulate) {
        encode(this,uVar5,(static_huffman_data_model *)&total_bits);
      }
      if (local_114 != 0) {
        if (!simulate) {
          encode_bits(this,(uint)(uVar2 >> 8),local_114);
        }
        i_5 = local_114 + i_5;
      }
    }
    this_local._4_4_ = i_5;
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&total_bits);
LAB_00213851:
  vector<unsigned_char>::~vector((vector<unsigned_char> *)&i_1);
  vector<unsigned_short>::~vector((vector<unsigned_short> *)local_48);
  return this_local._4_4_;
}

Assistant:

uint symbol_codec::encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate = false, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        uint total_used_syms = 0;
        for (uint i = model.m_total_syms; i > 0; i--)
        {
            if (model.m_code_sizes[i - 1])
            {
                total_used_syms = i;
                break;
            }
        }

        if (!total_used_syms)
        {
            if (!simulate)
            {
                encode_bits(0, math::total_bits(prefix_coding::cMaxSupportedSyms));
            }

            return math::total_bits(prefix_coding::cMaxSupportedSyms);
        }

        crnlib::vector<uint16> codes;
        codes.reserve(model.m_total_syms);

        uint prev_len = UINT_MAX;
        uint cur_zero_run_size = 0;
        uint cur_nonzero_run_size = 0;

        const uint8* pCodesizes = &model.m_code_sizes[0];

        crnlib::vector<uint8> delta_code_sizes;
        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            if (pDeltaModel->m_code_sizes.size() < total_used_syms)
            {
                return 0;
            }

            delta_code_sizes.resize(total_used_syms);
            for (uint i = 0; i < total_used_syms; i++)
            {
                int delta = (int)model.m_code_sizes[i] - (int)pDeltaModel->m_code_sizes[i];
                if (delta < 0)
                {
                    delta += 17;
                }
                delta_code_sizes[i] = static_cast<uint8>(delta);
            }

            pCodesizes = delta_code_sizes.get_ptr();
        }

        for (uint i = 0; i <= total_used_syms; i++)
        {
            const uint len = (i < total_used_syms) ? *pCodesizes++ : 0xFF;
            CRNLIB_ASSERT((len == 0xFF) || (len <= prefix_coding::cMaxExpectedCodeSize));

            if (!len)
            {
                end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

                if (++cur_zero_run_size == cMaxLargeZeroRunSize)
                {
                    end_zero_run(cur_zero_run_size, codes);
                }
            }
            else
            {
                end_zero_run(cur_zero_run_size, codes);

                if (len != prev_len)
                {
                    end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

                    if (len != 0xFF)
                    {
                        codes.push_back(static_cast<uint16>(len));
                    }
                }
                else if (++cur_nonzero_run_size == cLargeMaxNonZeroRunSize)
                {
                    end_nonzero_run(cur_nonzero_run_size, prev_len, codes);
                }
            }

            prev_len = len;
        }

        uint16 hist[cMaxCodelengthCodes];
        utils::zero_object(hist);

        for (uint i = 0; i < codes.size(); i++)
        {
            uint code = codes[i] & 0xFF;
            CRNLIB_ASSERT(code < cMaxCodelengthCodes);
            hist[code] = static_cast<uint16>(hist[code] + 1);
        }

        static_huffman_data_model dm;
        if (!dm.init(true, cMaxCodelengthCodes, hist, 7))
        {
            return 0;
        }

        uint num_codelength_codes_to_send;
        for (num_codelength_codes_to_send = cNumMostProbableCodelengthCodes; num_codelength_codes_to_send > 0; num_codelength_codes_to_send--)
        {
            if (dm.get_cost(g_most_probable_codelength_codes[num_codelength_codes_to_send - 1]))
            {
                break;
            }
        }

        uint total_bits = math::total_bits(prefix_coding::cMaxSupportedSyms);
        total_bits += 5;
        total_bits += 3 * num_codelength_codes_to_send;

        if (!simulate)
        {
            encode_bits(total_used_syms, math::total_bits(prefix_coding::cMaxSupportedSyms));

            encode_bits(num_codelength_codes_to_send, 5);
            for (uint i = 0; i < num_codelength_codes_to_send; i++)
            {
                encode_bits(dm.get_cost(g_most_probable_codelength_codes[i]), 3);
            }
        }

        for (uint i = 0; i < codes.size(); i++)
        {
            uint code = codes[i];
            uint extra = code >> 8;
            code &= 0xFF;

            uint extra_bits = 0;
            if (code == cSmallZeroRunCode)
            {
                extra_bits = cSmallZeroRunExtraBits;
            }
            else if (code == cLargeZeroRunCode)
            {
                extra_bits = cLargeZeroRunExtraBits;
            }
            else if (code == cSmallRepeatCode)
            {
                extra_bits = cSmallNonZeroRunExtraBits;
            }
            else if (code == cLargeRepeatCode)
            {
                extra_bits = cLargeNonZeroRunExtraBits;
            }

            total_bits += dm.get_cost(code);

            if (!simulate)
            {
                encode(code, dm);
            }

            if (extra_bits)
            {
                if (!simulate)
                {
                    encode_bits(extra, extra_bits);
                }

                total_bits += extra_bits;
            }
        }

        return total_bits;
    }